

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  Allocator *pAVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  void *ptr;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar1 = a->dims;
  if (iVar1 == 3) {
    uVar9 = a->w;
    uVar18 = (ulong)uVar9;
    uVar7 = a->h;
    uVar16 = (ulong)uVar7;
    iVar1 = a->c;
    lVar11 = (long)iVar1;
    uVar13 = uVar7 * uVar9;
    bVar19 = !reduce_w;
    bVar6 = !reduce_h;
    if ((bVar19 || bVar6) || !reduce_c) {
      if ((!bVar19 && !bVar6) && !reduce_c) {
        Mat::create(b,iVar1,sVar2,opt->blob_allocator);
        if (0 < iVar1) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar10 = a->data;
          pvVar12 = b->data;
          lVar15 = 0;
          do {
            fVar23 = 0.0;
            if (0 < (int)uVar13) {
              uVar18 = 0;
              do {
                fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar13 != uVar18);
            }
            *(float *)((long)pvVar12 + lVar15 * 4) = fVar23;
            lVar15 = lVar15 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
          } while (lVar15 != lVar11);
          return 0;
        }
        return 0;
      }
      lVar15 = (long)(int)uVar9;
      if ((!bVar19 && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar7,iVar1,sVar2,opt->blob_allocator);
        if (0 < iVar1) {
          pvVar10 = a->data;
          sVar2 = a->cstep;
          iVar1 = b->w;
          sVar3 = b->elemsize;
          sVar4 = a->elemsize;
          pvVar12 = b->data;
          lVar17 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar21 = 0;
              pvVar20 = pvVar10;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar22 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar20 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar18 != uVar22);
                }
                *(float *)((long)pvVar12 + uVar21 * 4 + lVar17 * (long)iVar1 * sVar3) = fVar23;
                uVar21 = uVar21 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar15 * 4);
              } while (uVar21 != uVar16);
            }
            lVar17 = lVar17 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar4);
          } while (lVar17 != lVar11);
          return 0;
        }
        return 0;
      }
      if ((!bVar19 && !reduce_h) && reduce_c) {
        Mat::create(b,uVar7,sVar2,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,1,uVar7,iVar1,sVar2,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar8 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001417bd;
        uVar13 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar13) {
          memset(local_78.data,0,(ulong)uVar13 << 2);
        }
        if (0 < iVar1) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar12 = a->data;
          lVar17 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar21 = 0;
              pvVar20 = pvVar12;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar22 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar20 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar18 != uVar22);
                }
                *(float *)((long)pvVar10 +
                          uVar21 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * lVar17)
                     = fVar23;
                uVar21 = uVar21 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar15 * 4);
              } while (uVar21 != uVar16);
            }
            lVar17 = lVar17 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar3);
          } while (lVar17 != lVar11);
        }
        uVar9 = b->c * (int)b->cstep;
        if (0 < (int)uVar9) {
          memset(b->data,0,(ulong)uVar9 << 2);
        }
        if (0 < iVar1) {
          pvVar10 = b->data;
          lVar15 = 0;
          pvVar12 = local_78.data;
          do {
            if (0 < (int)uVar7) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar10 + uVar18 * 4) =
                     *(float *)((long)pvVar12 + uVar18 * 4) + *(float *)((long)pvVar10 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar16 != uVar18);
            }
            lVar15 = lVar15 + 1;
            pvVar12 = (void *)((long)pvVar12 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar15 != lVar11);
        }
      }
      else {
        if ((bVar6 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar9,uVar7,sVar2,opt->blob_allocator);
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < iVar1) {
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              pvVar10 = a->data;
              pvVar12 = b->data;
              lVar15 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar12 + uVar18 * 4) =
                         *(float *)((long)pvVar10 + uVar18 * 4) +
                         *(float *)((long)pvVar12 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar13 != uVar18);
                }
                lVar15 = lVar15 + 1;
                pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              } while (lVar15 != lVar11);
              return 0;
            }
            return 0;
          }
          if ((bVar6 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar9,iVar1,sVar2,opt->blob_allocator);
          uVar13 = b->c * (int)b->cstep;
          if (0 < (int)uVar13) {
            memset(b->data,0,(ulong)uVar13 << 2);
          }
          if (0 < iVar1) {
            pvVar10 = a->data;
            sVar2 = a->cstep;
            pvVar12 = b->data;
            iVar1 = b->w;
            sVar3 = b->elemsize;
            sVar4 = a->elemsize;
            lVar17 = 0;
            do {
              if (0 < (int)uVar7) {
                uVar13 = 0;
                pvVar20 = pvVar10;
                do {
                  if (0 < (int)uVar9) {
                    uVar16 = 0;
                    do {
                      *(float *)((long)pvVar12 + uVar16 * 4) =
                           *(float *)((long)pvVar20 + uVar16 * 4) +
                           *(float *)((long)pvVar12 + uVar16 * 4);
                      uVar16 = uVar16 + 1;
                    } while (uVar18 != uVar16);
                  }
                  uVar13 = uVar13 + 1;
                  pvVar20 = (void *)((long)pvVar20 + lVar15 * 4);
                } while (uVar13 != uVar7);
              }
              lVar17 = lVar17 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar4);
              pvVar12 = (void *)((long)pvVar12 + (long)iVar1 * sVar3);
            } while (lVar17 != lVar11);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar9,sVar2,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,uVar9,1,iVar1,sVar2,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar8 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001417bd;
        uVar13 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar13) {
          memset(local_78.data,0,(ulong)uVar13 << 2);
        }
        if (0 < iVar1) {
          pvVar12 = a->data;
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          lVar17 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar13 = 0;
              pvVar20 = pvVar12;
              do {
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar16 * 4) =
                         *(float *)((long)pvVar20 + uVar16 * 4) +
                         *(float *)((long)pvVar10 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar18 != uVar16);
                }
                uVar13 = uVar13 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar15 * 4);
              } while (uVar13 != uVar7);
            }
            lVar17 = lVar17 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar3);
            pvVar10 = (void *)((long)pvVar10 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar17 != lVar11);
        }
        uVar7 = b->c * (int)b->cstep;
        if (0 < (int)uVar7) {
          memset(b->data,0,(ulong)uVar7 << 2);
        }
        if (0 < iVar1) {
          pvVar10 = b->data;
          lVar15 = 0;
          pvVar12 = local_78.data;
          do {
            if (0 < (int)uVar9) {
              uVar16 = 0;
              do {
                *(float *)((long)pvVar10 + uVar16 * 4) =
                     *(float *)((long)pvVar12 + uVar16 * 4) + *(float *)((long)pvVar10 + uVar16 * 4)
                ;
                uVar16 = uVar16 + 1;
              } while (uVar18 != uVar16);
            }
            lVar15 = lVar15 + 1;
            pvVar12 = (void *)((long)pvVar12 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar15 != lVar11);
        }
      }
      iVar8 = 0;
LAB_001417bd:
      Mat::~Mat(&local_78);
      return iVar8;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    if (iVar1 == 0) {
      return -100;
    }
    pAVar5 = opt->workspace_allocator;
    uVar18 = sVar2 * lVar11 + 3 & 0xfffffffffffffffc;
    if (pAVar5 == (Allocator *)0x0) {
      local_78.data = (void *)0x0;
      iVar8 = posix_memalign(&local_78.data,0x10,uVar18 + 4);
      pvVar10 = (void *)0x0;
      if (iVar8 == 0) {
        pvVar10 = local_78.data;
      }
    }
    else {
      pvVar10 = (void *)(**(code **)(*(long *)pAVar5 + 0x10))();
    }
    *(undefined4 *)((long)pvVar10 + uVar18) = 1;
    if (iVar1 < 1) {
LAB_00141478:
      fVar23 = 0.0;
    }
    else {
      pvVar12 = a->data;
      sVar2 = a->cstep;
      sVar3 = a->elemsize;
      lVar15 = 0;
      do {
        fVar23 = 0.0;
        if (0 < (int)uVar13) {
          uVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)((long)pvVar12 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        *(float *)((long)pvVar10 + lVar15 * 4) = fVar23;
        lVar15 = lVar15 + 1;
        pvVar12 = (void *)((long)pvVar12 + sVar2 * sVar3);
      } while (lVar15 != lVar11);
      if (iVar1 < 1) goto LAB_00141478;
      fVar23 = 0.0;
      lVar15 = 0;
      do {
        fVar23 = fVar23 + *(float *)((long)pvVar10 + lVar15 * 4);
        lVar15 = lVar15 + 1;
      } while (lVar11 != lVar15);
    }
    *(float *)b->data = fVar23;
    LOCK();
    piVar14 = (int *)((long)pvVar10 + uVar18);
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 != 0) {
      return 0;
    }
    if (pAVar5 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar5 + 0x18))(pAVar5,pvVar10);
      return 0;
    }
    goto LAB_0014162b;
  }
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      iVar1 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      if ((long)iVar1 < 1) {
        fVar23 = 0.0;
      }
      else {
        fVar23 = 0.0;
        lVar11 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)a->data + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (iVar1 != lVar11);
      }
      *(float *)b->data = fVar23;
      return 0;
    }
    return 0;
  }
  uVar9 = a->w;
  uVar18 = (ulong)uVar9;
  iVar1 = a->h;
  lVar11 = (long)iVar1;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,iVar1,sVar2,opt->blob_allocator);
      if (0 < iVar1) {
        pvVar10 = a->data;
        iVar1 = a->w;
        pvVar12 = b->data;
        sVar2 = a->elemsize;
        lVar15 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar16 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          *(float *)((long)pvVar12 + lVar15 * 4) = fVar23;
          lVar15 = lVar15 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar2);
        } while (lVar15 != lVar11);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar9,sVar2,opt->blob_allocator);
    uVar7 = b->c * (int)b->cstep;
    if (0 < (int)uVar7) {
      memset(b->data,0,(ulong)uVar7 << 2);
    }
    if (0 < iVar1) {
      pvVar10 = a->data;
      iVar1 = a->w;
      pvVar12 = b->data;
      sVar2 = a->elemsize;
      lVar15 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar16 = 0;
          do {
            *(float *)((long)pvVar12 + uVar16 * 4) =
                 *(float *)((long)pvVar10 + uVar16 * 4) + *(float *)((long)pvVar12 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
        lVar15 = lVar15 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * sVar2);
      } while (lVar15 != lVar11);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,sVar2,opt->blob_allocator);
  if (iVar1 == 0) {
    return -100;
  }
  pAVar5 = opt->workspace_allocator;
  piVar14 = (int *)(sVar2 * lVar11 + 3 & 0xfffffffffffffffc);
  if (pAVar5 == (Allocator *)0x0) {
    local_78.data = (void *)0x0;
    iVar8 = posix_memalign(&local_78.data,0x10,(size_t)(piVar14 + 1));
    pvVar10 = local_78.data;
    if (iVar8 != 0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      return -100;
    }
  }
  else {
    pvVar10 = (void *)(**(code **)(*(long *)pAVar5 + 0x10))();
  }
  *(undefined4 *)((long)pvVar10 + (long)piVar14) = 1;
  if (iVar1 < 1) {
LAB_001412f1:
    fVar23 = 0.0;
  }
  else {
    pvVar12 = a->data;
    iVar8 = a->w;
    sVar2 = a->elemsize;
    lVar15 = 0;
    do {
      fVar23 = 0.0;
      if (0 < (int)uVar9) {
        uVar16 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)pvVar12 + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
      }
      *(float *)((long)pvVar10 + lVar15 * 4) = fVar23;
      lVar15 = lVar15 + 1;
      pvVar12 = (void *)((long)pvVar12 + (long)iVar8 * sVar2);
    } while (lVar15 != lVar11);
    if (iVar1 < 1) goto LAB_001412f1;
    fVar23 = 0.0;
    lVar15 = 0;
    do {
      fVar23 = fVar23 + *(float *)((long)pvVar10 + lVar15 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar11 != lVar15);
  }
  *(float *)b->data = fVar23;
  LOCK();
  piVar14 = (int *)((long)pvVar10 + (long)piVar14);
  *piVar14 = *piVar14 + -1;
  UNLOCK();
  if (*piVar14 != 0) {
    return 0;
  }
  if (pAVar5 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar5 + 0x18))(pAVar5,pvVar10);
    return 0;
  }
LAB_0014162b:
  free(pvVar10);
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}